

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

int __thiscall libchars::validation::add_validator__(validation *this,id_t id,validator *v)

{
  const_iterator cVar1;
  mapped_type mVar2;
  bool bVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  mapped_type *ppvVar6;
  iterator local_68;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_60;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_50;
  const_iterator ni;
  _Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_> local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_> local_30;
  const_iterator ii;
  validator *v_local;
  validation *pvStack_18;
  id_t id_local;
  validation *this_local;
  
  if (v == (validator *)0x0) {
    this_local._4_4_ = -1;
  }
  else if (id == 0) {
    this_local._4_4_ = -1;
  }
  else {
    ii._M_node = (_Base_ptr)v;
    v_local._4_4_ = id;
    pvStack_18 = this;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_const_libchars::validator_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
         ::find(&this->i2v,(key_type *)((long)&v_local + 4));
    std::_Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_>::
    _Rb_tree_const_iterator(&local_30,&local_38);
    ni._M_node = (_Base_ptr)
                 std::
                 map<int,_const_libchars::validator_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
                 ::end(&this->i2v);
    std::_Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_>::
    _Rb_tree_const_iterator(&local_40,(iterator *)&ni);
    bVar3 = std::operator!=(&local_30,&local_40);
    if (bVar3) {
      this_local._4_4_ = -1;
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_58._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&this->n2i,(key_type *)&(ii._M_node)->_M_left);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        ::_Rb_tree_const_iterator(&local_50,&local_58);
        local_68._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end(&this->n2i);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        ::_Rb_tree_const_iterator(&local_60,&local_68);
        bVar3 = std::operator!=(&local_50,&local_60);
        mVar2 = v_local._4_4_;
        if (bVar3) {
          return -1;
        }
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->n2i,(key_type *)&(ii._M_node)->_M_left);
        *pmVar5 = mVar2;
      }
      cVar1._M_node = ii._M_node;
      ppvVar6 = std::
                map<int,_const_libchars::validator_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
                ::operator[](&this->i2v,(key_type *)((long)&v_local + 4));
      *ppvVar6 = (mapped_type)cVar1._M_node;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int validation::add_validator__(validator::id_t id, const validator *v)
    {
        if (v == NULL)
            return -1;
        if (id == validator::NONE)
            return -1;

        validators_by_id_t::const_iterator ii = i2v.find(id);
        if (ii != i2v.end())
            return -1; // duplicate

        if (!v->name.empty()) {
            vtype_by_name_t::const_iterator ni = n2i.find(v->name);
            if (ni != n2i.end())
                return -1; // duplicate
            n2i[v->name] = id;
        }

        i2v[id] = v;

        return 0;
    }